

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

void __thiscall chaiscript::exception::eval_error::eval_error(eval_error *this,eval_error *param_1)

{
  eval_error *param_1_local;
  eval_error *this_local;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,&param_1->super_runtime_error);
  *(undefined ***)this = &PTR__eval_error_0087c040;
  std::__cxx11::string::string((string *)&this->reason,&param_1->reason);
  this->start_position = param_1->start_position;
  std::__cxx11::string::string((string *)&this->filename,&param_1->filename);
  std::__cxx11::string::string((string *)&this->detail,&param_1->detail);
  std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::vector
            (&this->call_stack,&param_1->call_stack);
  return;
}

Assistant:

eval_error(const eval_error &) = default;